

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

VkImageViewType vkt::sr::anon_unknown_0::textureTypeToImageViewType(Type type)

{
  VkImageViewType local_c;
  Type type_local;
  
  switch(type) {
  case TYPE_1D:
    local_c = VK_IMAGE_VIEW_TYPE_1D;
    break;
  case TYPE_2D:
    local_c = VK_IMAGE_VIEW_TYPE_2D;
    break;
  case TYPE_3D:
    local_c = VK_IMAGE_VIEW_TYPE_3D;
    break;
  case TYPE_CUBE_MAP:
    local_c = VK_IMAGE_VIEW_TYPE_CUBE;
    break;
  case TYPE_1D_ARRAY:
    local_c = VK_IMAGE_VIEW_TYPE_1D_ARRAY;
    break;
  case TYPE_2D_ARRAY:
    local_c = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
    break;
  case TYPE_CUBE_ARRAY:
    local_c = VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
    break;
  default:
    local_c = VK_IMAGE_VIEW_TYPE_1D;
  }
  return local_c;
}

Assistant:

static VkImageViewType textureTypeToImageViewType (TextureBinding::Type type)
{
	switch (type)
	{
		case TextureBinding::TYPE_1D:			return VK_IMAGE_VIEW_TYPE_1D;
		case TextureBinding::TYPE_2D:			return VK_IMAGE_VIEW_TYPE_2D;
		case TextureBinding::TYPE_3D:			return VK_IMAGE_VIEW_TYPE_3D;
		case TextureBinding::TYPE_CUBE_MAP:		return VK_IMAGE_VIEW_TYPE_CUBE;
		case TextureBinding::TYPE_1D_ARRAY:		return VK_IMAGE_VIEW_TYPE_1D_ARRAY;
		case TextureBinding::TYPE_2D_ARRAY:		return VK_IMAGE_VIEW_TYPE_2D_ARRAY;
		case TextureBinding::TYPE_CUBE_ARRAY:	return VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;

		default:
			DE_FATAL("Impossible");
			return (VkImageViewType)0;
	}
}